

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O0

void __thiscall Js::NumberSet::NumberSet(NumberSet *this)

{
  NumberSet *this_local;
  
  JsUtil::
  BaseHashSet<unsigned_int,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet(&this->set,(AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,0);
  return;
}

Assistant:

NumberSet::NumberSet() : set(&NoCheckHeapAllocator::Instance) {}